

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O3

void upack_loc(char **buf,LocMsg *lmsg)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  uint uVar4;
  
  pcVar3 = upack_str(buf);
  lmsg->file = pcVar3;
  pbVar2 = (byte *)*buf;
  bVar1 = *pbVar2;
  uVar4 = (uint)pbVar2[3] | (uint)pbVar2[1] << 0x10 | (uint)pbVar2[2] << 8 | (uint)bVar1 << 0x18;
  *buf = (char *)(pbVar2 + 4);
  if (-1 < (int)((uint)bVar1 << 0x18)) {
    lmsg->line = uVar4;
    return;
  }
  eprintf("Unpacked value (%u) too big for lmsg->line, max allowed %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
          ,0x13f,(ulong)uVar4,0x7fffffff);
}

Assistant:

static void upack_loc(char **buf, LocMsg * lmsg)
{
    ck_uint32 line;
    lmsg->file = upack_str(buf);
    line = upack_int(buf);
    if(line > INT_MAX)
        eprintf("Unpacked value (%u) too big for lmsg->line, max allowed %d\n",
                __FILE__, __LINE__ - 3, line, INT_MAX);
    lmsg->line = (int) line;
}